

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

uint mp_cmp_hs(mp_int *a,mp_int *b)

{
  BignumCarry BVar1;
  ulong rw;
  
  rw = b->nw;
  if (b->nw < a->nw) {
    rw = a->nw;
  }
  BVar1 = mp_add_masked_into((BignumInt *)0x0,rw,a,b,0xffffffffffffffff,0xffffffffffffffff,1);
  return (uint)BVar1;
}

Assistant:

unsigned mp_cmp_hs(mp_int *a, mp_int *b)
{
    size_t rw = size_t_max(a->nw, b->nw);
    return mp_add_masked_into(NULL, rw, a, b, ~(BignumInt)0, ~(BignumInt)0, 1);
}